

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitBreak
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Break *curr)

{
  pointer pLVar1;
  char *pcVar2;
  Flow *pFVar3;
  Flow *pFVar4;
  Flow *pFVar5;
  Type *pTVar6;
  int64_t iVar7;
  pointer *ppLVar8;
  undefined1 auStack_b8 [8];
  Flow flow;
  undefined1 local_68 [8];
  Flow conditionFlow;
  
  flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
  ._M_str = (char *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  flow.breakTo.super_IString.str._M_len = 0;
  if (curr->value == (Expression *)0x0) {
LAB_00d2c6f5:
    if (curr->condition != (Expression *)0x0) {
      visit((Flow *)local_68,this,curr->condition);
      if (conditionFlow.breakTo.super_IString.str._M_len == 0) {
        if (((long)((long)conditionFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   conditionFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type
                   .id) >> 3) * -0x5555555555555555 + (long)local_68 != 1) {
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x52,"const Literal &wasm::Flow::getSingleValue()");
        }
        iVar7 = Literal::getInteger((Literal *)&conditionFlow);
        if (iVar7 != 0) {
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &conditionFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                      type);
          Literal::~Literal((Literal *)&conditionFlow);
          goto LAB_00d2c7bc;
        }
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)auStack_b8;
        Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems,(Literal *)&flow);
        pFVar3 = &flow;
        pFVar4 = &flow;
        pFVar5 = &flow;
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)local_68;
        Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems,(Literal *)&conditionFlow);
        pFVar3 = &conditionFlow;
        pFVar4 = &conditionFlow;
        pFVar5 = &conditionFlow;
      }
      ppLVar8 = (pointer *)
                ((long)&(pFVar5->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl +
                0x10);
      pTVar6 = &(pFVar3->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type;
      pLVar1 = *(pointer *)(pTVar6 + 1);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pTVar6->id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar1;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&(pFVar4->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl + 8);
      pTVar6->id = 0;
      pTVar6[1] = 0;
      pTVar6[2] = 0;
      pcVar2 = (char *)ppLVar8[1];
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = (size_t)*ppLVar8;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &conditionFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type)
      ;
      Literal::~Literal((Literal *)&conditionFlow);
      goto LAB_00d2c806;
    }
LAB_00d2c7bc:
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(curr->name).super_IString.str._M_len;
    flow.breakTo.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)auStack_b8;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
  }
  else {
    visit((Flow *)local_68,this,curr->value);
    SmallVector<wasm::Literal,_1UL>::operator=
              ((SmallVector<wasm::Literal,_1UL> *)auStack_b8,
               (SmallVector<wasm::Literal,_1UL> *)local_68);
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         conditionFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    flow.breakTo.super_IString.str._M_len = conditionFlow.breakTo.super_IString.str._M_len;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &conditionFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&conditionFlow);
    if (flow.breakTo.super_IString.str._M_len == 0) goto LAB_00d2c6f5;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)auStack_b8;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
  }
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_finish;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len =
       (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str =
       (char *)flow.breakTo.super_IString.str._M_len;
LAB_00d2c806:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitBreak(Break* curr) {
    NOTE_ENTER("Break");
    bool condition = true;
    Flow flow;
    if (curr->value) {
      flow = visit(curr->value);
      if (flow.breaking()) {
        return flow;
      }
    }
    if (curr->condition) {
      Flow conditionFlow = visit(curr->condition);
      if (conditionFlow.breaking()) {
        return conditionFlow;
      }
      condition = conditionFlow.getSingleValue().getInteger() != 0;
      if (!condition) {
        return flow;
      }
    }
    flow.breakTo = curr->name;
    return flow;
  }